

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O0

void __thiscall QGraphicsView::invalidateScene(QGraphicsView *this,QRectF *rect,SceneLayers layers)

{
  Int IVar1;
  QGraphicsViewPrivate *pQVar2;
  ulong uVar3;
  QWidget *in_RSI;
  QAbstractScrollArea *in_RDI;
  long in_FS_OFFSET;
  bool bVar4;
  QGraphicsViewPrivate *d;
  QRect viewRect;
  SceneLayer in_stack_ffffffffffffff8c;
  QRect local_48;
  QRectF *in_stack_ffffffffffffffd0;
  QRectF *in_stack_ffffffffffffffd8;
  QFlagsStorageHelper<QGraphicsScene::SceneLayer,_4> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QGraphicsView *)0xa38893);
  local_10.super_QFlagsStorage<QGraphicsScene::SceneLayer>.i =
       (QFlagsStorage<QGraphicsScene::SceneLayer>)
       QFlags<QGraphicsScene::SceneLayer>::operator&
                 ((QFlags<QGraphicsScene::SceneLayer> *)in_RDI,in_stack_ffffffffffffff8c);
  IVar1 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_10);
  bVar4 = false;
  if (IVar1 != 0) {
    bVar4 = (*(uint *)&pQVar2->field_0x300 >> 0xb & 1) == 0;
  }
  if (bVar4) {
    mapFromScene((QGraphicsView *)&DAT_aaaaaaaaaaaaaaaa,in_stack_ffffffffffffffd8);
    QPolygon::boundingRect();
    QPolygon::~QPolygon((QPolygon *)0xa38936);
    QAbstractScrollArea::viewport(in_RDI);
    local_48 = QWidget::rect(in_RSI);
    uVar3 = QRect::intersects((QRect *)&local_48);
    if ((uVar3 & 1) != 0) {
      QRegion::operator+=(&pQVar2->backgroundPixmapExposed,(QRect *)&stack0xffffffffffffffe0);
      bVar4 = ::QPointer::operator_cast_to_bool((QPointer<QGraphicsScene> *)0xa3898e);
      if (bVar4) {
        QPointer<QGraphicsScene>::operator->((QPointer<QGraphicsScene> *)0xa389a5);
        QGraphicsScene::update
                  ((QGraphicsScene *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsView::invalidateScene(const QRectF &rect, QGraphicsScene::SceneLayers layers)
{
    Q_D(QGraphicsView);
    if ((layers & QGraphicsScene::BackgroundLayer) && !d->mustResizeBackgroundPixmap) {
        QRect viewRect = mapFromScene(rect).boundingRect();
        if (viewport()->rect().intersects(viewRect)) {
            // The updated background area is exposed; schedule this area for
            // redrawing.
            d->backgroundPixmapExposed += viewRect;
            if (d->scene)
                d->scene->update(rect);
        }
    }
}